

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexIncrWriter::finish(PtexIncrWriter *this)

{
  uint uVar1;
  __off_t _Var2;
  size_t __size;
  
  if ((this->super_PtexWriterBase)._metadata.
      super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_PtexWriterBase)._metadata.
      super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    writeMetaDataEdit(this);
  }
  if ((this->super_PtexWriterBase)._extheader.editdatapos != 0) {
    _Var2 = ftello((FILE *)this->_fp);
    (this->super_PtexWriterBase)._extheader.editdatasize =
         _Var2 - (this->super_PtexWriterBase)._extheader.editdatapos;
    fseeko((FILE *)this->_fp,0x40,0);
    uVar1 = (this->super_PtexWriterBase)._header.extheadersize;
    __size = 0x28;
    if (uVar1 < 0x28) {
      __size = (size_t)uVar1;
    }
    fwrite(&(this->super_PtexWriterBase)._extheader,__size,1,(FILE *)this->_fp);
    return;
  }
  return;
}

Assistant:

void PtexIncrWriter::finish()
{
    // write meta data edit block (if any)
    if (!_metadata.empty()) writeMetaDataEdit();

    // rewrite extheader for updated editdatasize
    if (_extheader.editdatapos) {
        _extheader.editdatasize = uint64_t(ftello(_fp)) - _extheader.editdatapos;
        fseeko(_fp, HeaderSize, SEEK_SET);
        fwrite(&_extheader, PtexUtils::min(uint32_t(ExtHeaderSize), _header.extheadersize), 1, _fp);
    }
}